

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

bool __thiscall CASC_ARRAY::EnlargeArray(CASC_ARRAY *this,size_t NewItemCount)

{
  ulong uVar1;
  ulong uVar2;
  LPBYTE pBVar3;
  bool bVar4;
  
  if (this->m_pItemArray == (LPBYTE)0x0) {
    __assert_fail("m_pItemArray != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                  ,0x99,"bool CASC_ARRAY::EnlargeArray(size_t)");
  }
  uVar1 = this->m_ItemCountMax;
  if (uVar1 != 0) {
    bVar4 = true;
    if (uVar1 < NewItemCount) {
      do {
        uVar2 = uVar1;
        uVar1 = uVar2 * 2;
      } while (uVar2 < NewItemCount);
      pBVar3 = (LPBYTE)realloc(this->m_pItemArray,this->m_ItemSize * uVar2);
      if (pBVar3 == (LPBYTE)0x0) {
        bVar4 = false;
      }
      else {
        this->m_ItemCountMax = uVar2;
        this->m_pItemArray = pBVar3;
      }
    }
    return bVar4;
  }
  __assert_fail("m_ItemCountMax != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                ,0x9a,"bool CASC_ARRAY::EnlargeArray(size_t)");
}

Assistant:

bool EnlargeArray(size_t NewItemCount)
    {
        LPBYTE NewItemArray;
        size_t ItemCountMax;

        // We expect the array to be already allocated
        assert(m_pItemArray != NULL);
        assert(m_ItemCountMax != 0);

        // Shall we enlarge the table?
        if (NewItemCount > m_ItemCountMax)
        {
            // Calculate new table size
            ItemCountMax = m_ItemCountMax;
            while (ItemCountMax < NewItemCount)
                ItemCountMax = ItemCountMax << 1;

            // Allocate new table
            NewItemArray = CASC_REALLOC(BYTE, m_pItemArray, (ItemCountMax * m_ItemSize));
            if (NewItemArray == NULL)
                return false;

            // Set the new table size
            m_ItemCountMax = ItemCountMax;
            m_pItemArray = NewItemArray;
        }

        return true;
    }